

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string *name,bool expecting_enum)

{
  Tables *this_00;
  Symbol SVar1;
  string lookup_name;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)&lookup_name,(string *)name);
  if ((lookup_name._M_string_length != 0) && (*lookup_name._M_dataplus._M_p == '.')) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)&lookup_name);
    std::__cxx11::string::operator=((string *)&lookup_name,local_30);
    std::__cxx11::string::~string(local_30);
  }
  this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                      (&this->tables_);
  SVar1 = Tables::FindByNameHelper(this_00,this,&lookup_name);
  std::__cxx11::string::~string((string *)&lookup_name);
  SVar1._4_4_ = 0;
  return SVar1;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(const string& name,
                                               bool expecting_enum) const {
  string lookup_name = name;
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}